

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface_p.h
# Opt level: O2

void __thiscall
QFutureCallOutEvent::QFutureCallOutEvent
          (QFutureCallOutEvent *this,CallOutType callOutType,int index1,QString *text)

{
  QEvent::QEvent(&this->super_QEvent,FutureCallOut);
  (this->super_QEvent)._vptr_QEvent = (_func_int **)&PTR__QFutureCallOutEvent_00668ff0;
  this->callOutType = callOutType;
  this->index1 = index1;
  this->index2 = -1;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&(this->text).d,&text->d);
  return;
}

Assistant:

QFutureCallOutEvent(CallOutType callOutType, int index1, const QString &text)
        : QEvent(QEvent::FutureCallOut),
          callOutType(callOutType),
          index1(index1),
          index2(-1),
          text(text)
    { }